

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O0

mempool * mempool_iterator_next(mempool_iterator *it)

{
  uint uVar1;
  mempool_iterator *local_20;
  small_mempool *small_mempool;
  mempool_iterator *it_local;
  
  local_20 = (mempool_iterator *)0x0;
  if (it->small_iterator < it->alloc->small_mempool_cache_size) {
    uVar1 = it->small_iterator;
    it->small_iterator = uVar1 + 1;
    local_20 = (mempool_iterator *)(it->alloc->small_mempool_cache + uVar1);
  }
  if (local_20 == (mempool_iterator *)0x0) {
    it_local = (mempool_iterator *)0x0;
  }
  else {
    it_local = local_20;
  }
  return (mempool *)it_local;
}

Assistant:

struct mempool *
mempool_iterator_next(struct mempool_iterator *it)
{
	struct small_mempool *small_mempool = NULL;
	if (it->small_iterator < it->alloc->small_mempool_cache_size)
		small_mempool =
			&it->alloc->small_mempool_cache[(it->small_iterator)++];
	if (small_mempool)
		return &(small_mempool->pool);

	return NULL;
}